

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O2

void sse_w4x4_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,__m256i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  long lVar8;
  
  lVar7 = (long)a_stride;
  auVar1 = vpinsrd_avx(ZEXT416(*(uint *)a),*(undefined4 *)(a + lVar7),1);
  lVar8 = (long)b_stride;
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(a + lVar7 * 2)),*(undefined4 *)(a + lVar7 * 3),1);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)b),*(undefined4 *)(b + lVar8),1);
  auVar2 = vpunpcklqdq_avx(auVar1,auVar2);
  auVar1 = vpinsrd_avx(ZEXT416(*(uint *)(b + lVar8 * 2)),*(undefined4 *)(b + lVar8 * 3),1);
  auVar1 = vpunpcklqdq_avx(auVar3,auVar1);
  auVar5 = vpmovzxbw_avx2(auVar2);
  auVar6 = vpmovzxbw_avx2(auVar1);
  auVar5 = vpsubw_avx2(auVar5,auVar6);
  auVar5 = vpmaddwd_avx2(auVar5,auVar5);
  alVar4 = (__m256i)vpaddd_avx2(auVar5,(undefined1  [32])*sum);
  *sum = alVar4;
  return;
}

Assistant:

static inline void sse_w4x4_avx2(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, __m256i *sum) {
  const __m128i v_a0 = xx_loadl_32(a);
  const __m128i v_a1 = xx_loadl_32(a + a_stride);
  const __m128i v_a2 = xx_loadl_32(a + a_stride * 2);
  const __m128i v_a3 = xx_loadl_32(a + a_stride * 3);
  const __m128i v_b0 = xx_loadl_32(b);
  const __m128i v_b1 = xx_loadl_32(b + b_stride);
  const __m128i v_b2 = xx_loadl_32(b + b_stride * 2);
  const __m128i v_b3 = xx_loadl_32(b + b_stride * 3);
  const __m128i v_a0123 = _mm_unpacklo_epi64(_mm_unpacklo_epi32(v_a0, v_a1),
                                             _mm_unpacklo_epi32(v_a2, v_a3));
  const __m128i v_b0123 = _mm_unpacklo_epi64(_mm_unpacklo_epi32(v_b0, v_b1),
                                             _mm_unpacklo_epi32(v_b2, v_b3));
  const __m256i v_a_w = _mm256_cvtepu8_epi16(v_a0123);
  const __m256i v_b_w = _mm256_cvtepu8_epi16(v_b0123);
  const __m256i v_d_w = _mm256_sub_epi16(v_a_w, v_b_w);
  *sum = _mm256_add_epi32(*sum, _mm256_madd_epi16(v_d_w, v_d_w));
}